

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_reverse_iterator_loop_Test::~VectorSUnitTest_reverse_iterator_loop_Test
          (VectorSUnitTest_reverse_iterator_loop_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, reverse_iterator_loop)
{
    using vec_t = vector_s<size_t, 4>;
    {
        vec_t v{4u,3u,2u,1u};
        size_t count = 0;
        for (vec_t::reverse_iterator it = v.rbegin(); it != v.rend(); ++it) {
            ++count;
            EXPECT_EQ(count, *it);
            *it = count + 1u;
        }
        EXPECT_EQ(4u, count);
        EXPECT_EQ(5u, v[0]);
        EXPECT_EQ(4u, v[1]);
        EXPECT_EQ(3u, v[2]);
        EXPECT_EQ(2u, v[3]);
    }

    // const
    {
        const vec_t v{4u,3u,2u,1u};
        size_t count = 0;
        for (auto it = v.crbegin(); it != v.crend(); ++it) {
            ++count;
            EXPECT_EQ(count, *it);
        }
        EXPECT_EQ(4u, count);
    }
}